

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_std_file_read_write(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue val;
  JSValue val_00;
  JSValue obj;
  long lVar1;
  int iVar2;
  FILE *__stream;
  uint8_t *puVar3;
  size_t sVar4;
  JSContext *in_RDI;
  int in_R9D;
  JSValue JVar5;
  uint8_t *buf;
  size_t ret;
  size_t size;
  uint64_t len;
  uint64_t pos;
  FILE *f;
  JSValue v;
  JSContext *in_stack_ffffffffffffff38;
  JSValueUnion in_stack_ffffffffffffff40;
  JSContext *in_stack_ffffffffffffff48;
  JSValueUnion in_stack_ffffffffffffff50;
  JSValueUnion local_70;
  int64_t local_68;
  JSValueUnion local_60;
  int64_t local_58;
  JSValueUnion local_30;
  int64_t local_28;
  undefined4 uStack_c;
  
  JVar5.tag = (int64_t)in_stack_ffffffffffffff48;
  JVar5.u.ptr = in_stack_ffffffffffffff40.ptr;
  __stream = (FILE *)js_std_file_get(in_stack_ffffffffffffff38,JVar5);
  lVar1 = local_70;
  if (__stream == (FILE *)0x0) {
    local_70.ptr = (void *)(lVar1 << 0x20);
    local_68 = 6;
  }
  else {
    val.tag = (int64_t)__stream;
    val.u.float64 = in_stack_ffffffffffffff50.float64;
    iVar2 = JS_ToIndex(in_stack_ffffffffffffff48,(uint64_t *)in_stack_ffffffffffffff40.ptr,val);
    if (iVar2 == 0) {
      val_00.tag = (int64_t)__stream;
      val_00.u.float64 = in_stack_ffffffffffffff50.float64;
      iVar2 = JS_ToIndex(in_stack_ffffffffffffff48,(uint64_t *)in_stack_ffffffffffffff40.ptr,val_00)
      ;
      if (iVar2 == 0) {
        obj.tag = (int64_t)__stream;
        obj.u.float64 = in_stack_ffffffffffffff50.float64;
        puVar3 = JS_GetArrayBuffer(in_stack_ffffffffffffff48,(size_t *)in_stack_ffffffffffffff40.ptr
                                   ,obj);
        if (puVar3 == (uint8_t *)0x0) {
          local_70.ptr = (void *)(lVar1 << 0x20);
          local_68 = 6;
        }
        else if ((ulong)in_stack_ffffffffffffff40 <
                 in_stack_ffffffffffffff50.ptr + (long)in_stack_ffffffffffffff48) {
          _local_70 = JS_ThrowRangeError(in_RDI,"read/write array buffer overflow");
        }
        else {
          if (in_R9D == 0) {
            sVar4 = fread(puVar3 + (long)in_stack_ffffffffffffff50.ptr,1,
                          (size_t)in_stack_ffffffffffffff48,__stream);
          }
          else {
            sVar4 = fwrite(puVar3 + (long)in_stack_ffffffffffffff50.ptr,1,
                           (size_t)in_stack_ffffffffffffff48,__stream);
          }
          if (sVar4 == (long)(int)sVar4) {
            local_30._4_4_ = uStack_c;
            local_30.int32 = (int)sVar4;
            local_28 = 0;
          }
          else {
            JVar5 = __JS_NewFloat64(in_RDI,(double)(long)sVar4);
            local_60 = JVar5.u;
            local_30 = local_60;
            local_58 = JVar5.tag;
            local_28 = local_58;
          }
          local_68 = local_28;
          local_70.float64 = local_30.float64;
        }
      }
      else {
        local_70.ptr = (void *)(lVar1 << 0x20);
        local_68 = 6;
      }
    }
    else {
      local_70.ptr = (void *)(lVar1 << 0x20);
      local_68 = 6;
    }
  }
  return _local_70;
}

Assistant:

static JSValue js_std_file_read_write(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv, int magic)
{
    FILE *f = js_std_file_get(ctx, this_val);
    uint64_t pos, len;
    size_t size, ret;
    uint8_t *buf;
    
    if (!f)
        return JS_EXCEPTION;
    if (JS_ToIndex(ctx, &pos, argv[1]))
        return JS_EXCEPTION;
    if (JS_ToIndex(ctx, &len, argv[2]))
        return JS_EXCEPTION;
    buf = JS_GetArrayBuffer(ctx, &size, argv[0]);
    if (!buf)
        return JS_EXCEPTION;
    if (pos + len > size)
        return JS_ThrowRangeError(ctx, "read/write array buffer overflow");
    if (magic)
        ret = fwrite(buf + pos, 1, len, f);
    else
        ret = fread(buf + pos, 1, len, f);
    return JS_NewInt64(ctx, ret);
}